

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand32.c
# Opt level: O0

float frand32(void)

{
  uint32_t uVar1;
  anon_union_4_2_947300a4 pun;
  
  uVar1 = rand32();
  return (float)(uVar1 & 0x7fffff | 0x3f800000) - 1.0;
}

Assistant:

float frand32()
{
#if USE_IEEE_754 

    union 
	{ 
		uint32_t i; 
		float    f; 
	} pun;

    pun.i = 0x3f800000UL | (rand32() & 0x007fffffUL);
    return pun.f - 1.0f;

#else

    static const float ONE_OVER_MAX_UINT32 = 1.0f / 0xffffffffUL;

    return rand32() * ONE_OVER_MAX_UINT32;

#endif
}